

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ssize_t __thiscall Args::write(Args *this,int __fd,void *__buf,size_t __n)

{
  string *file_name;
  char cVar1;
  int iVar2;
  DynamicFormat *pDVar3;
  FILE *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  path *this_00;
  runtime_error *this_01;
  undefined4 in_register_00000034;
  vector<char,_std::allocator<char>_> data;
  string error;
  allocator<char> local_119;
  path local_118;
  path local_e8;
  path local_c0;
  path local_98;
  path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  file_name = &this->output_file;
  pDVar3 = get_format(&this->output_format,(string_view)(ZEXT816(0x1400b4) << 0x40),file_name);
  if (this->keep_hashed == false) {
    cVar1 = (**(code **)(*(long *)pDVar3 + 0x18))(pDVar3);
    if (cVar1 == '\0') {
      unhash(this,(Bin *)CONCAT44(in_register_00000034,__fd));
    }
  }
  if ((this->output_file)._M_string_length == 0) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->input_file,"-");
    if (iVar2 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (file_name,0,(this->output_file)._M_string_length,"-",1);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_e8,&this->input_file,auto_format);
      local_70._M_pathname._0_16_ = (**(code **)(*(long *)pDVar3 + 0x10))(pDVar3);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_118,(basic_string_view<char,_std::char_traits<char>_> *)&local_70,
                 auto_format);
      this_00 = (path *)std::filesystem::__cxx11::path::replace_extension(&local_e8);
      std::filesystem::__cxx11::path::
      generic_string<char,std::char_traits<char>,std::allocator<char>>
                (&local_c0._M_pathname,this_00,(allocator<char> *)&local_98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (file_name,&local_c0._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_pathname._M_dataplus._M_p != &local_c0._M_pathname.field_2) {
        operator_delete(local_c0._M_pathname._M_dataplus._M_p,
                        local_c0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_118);
      std::filesystem::__cxx11::path::~path(&local_e8);
      if ((this->recursive == true) && ((this->output_dir)._M_string_length != 0)) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_118,&this->output_dir,auto_format);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_70,file_name,auto_format);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_98,&this->input_dir,auto_format);
        std::filesystem::relative(&local_c0,&local_70);
        std::filesystem::__cxx11::operator/(&local_e8,&local_118,&local_c0);
        std::filesystem::__cxx11::path::
        generic_string<char,std::char_traits<char>,std::allocator<char>>
                  (&local_48,&local_e8,&local_119);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (file_name,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_e8);
        std::filesystem::__cxx11::path::~path(&local_c0);
        std::filesystem::__cxx11::path::~path(&local_98);
        std::filesystem::__cxx11::path::~path(&local_70);
        std::filesystem::__cxx11::path::~path(&local_118);
      }
    }
  }
  if (this->log == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Serializing...",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  local_118._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_118._M_pathname._M_string_length = 0;
  local_118._M_pathname.field_2._M_allocated_capacity = 0;
  (**(code **)(*(long *)pDVar3 + 0x28))(&local_e8,pDVar3,(Bin *)CONCAT44(in_register_00000034,__fd))
  ;
  if (local_e8._M_pathname._M_string_length == 0) {
    __s = (FILE *)open_file<(char)119>(this,file_name);
    if (this->log == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Writing data...",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    fwrite(local_118._M_pathname._M_dataplus._M_p,1,
           local_118._M_pathname._M_string_length - (long)local_118._M_pathname._M_dataplus._M_p,__s
          );
    fflush(__s);
    fclose(__s);
    paVar4 = &local_e8._M_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_pathname._M_dataplus._M_p != paVar4) {
      operator_delete(local_e8._M_pathname._M_dataplus._M_p,
                      local_e8._M_pathname.field_2._M_allocated_capacity + 1);
      paVar4 = extraout_RAX;
    }
    if (local_118._M_pathname._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_118._M_pathname._M_dataplus._M_p,
                      local_118._M_pathname.field_2._M_allocated_capacity -
                      (long)local_118._M_pathname._M_dataplus._M_p);
      paVar4 = extraout_RAX_00;
    }
    return (ssize_t)paVar4;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&local_e8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(Bin& bin) {
        auto format = get_format(output_format, "", output_file);
        if (!keep_hashed && !format->output_allways_hashed()) {
            unhash(bin);
        }
        if (output_file.empty()) {
            if (input_file == "-") {
                output_file = "-";
            } else {
                output_file = fs::path(input_file).replace_extension(format->default_extension()).generic_string();
                if (recursive && !output_dir.empty()) {
                    output_file = (output_dir / fs::relative(output_file, input_dir)).generic_string();
                }
            }
        }

        if (log) {
            std::cerr << "Serializing..." << std::endl;
        }
        std::vector<char> data;
        auto error = format->write(bin, data);
        if (!error.empty()) {
            throw std::runtime_error(error);
        }

        auto file = open_file<'w'>(output_file);
        if (log) {
            std::cerr << "Writing data..." << std::endl;
        }
        fwrite(data.data(), 1, data.size(), file);
        fflush(file);
        fclose(file);
    }